

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O3

string * __thiscall
soul::SourceCodeOperations::ModuleDeclaration::getFullyQualifiedName_abi_cxx11_
          (string *__return_storage_ptr__,ModuleDeclaration *this)

{
  string local_88;
  IdentifierPath local_68;
  
  (*(this->module->super_ASTObject)._vptr_ASTObject[0xe])(&local_68);
  IdentifierPath::toString_abi_cxx11_(&local_88,&local_68);
  Program::stripRootNamespaceFromQualifiedPath(__return_storage_ptr__,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_68.pathSections.numActive = 0;
  if ((8 < local_68.pathSections.numAllocated) && (local_68.pathSections.items != (Identifier *)0x0)
     ) {
    operator_delete__(local_68.pathSections.items);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SourceCodeOperations::ModuleDeclaration::getFullyQualifiedName() const
{
    return Program::stripRootNamespaceFromQualifiedPath (module.getFullyQualifiedDisplayPath().toString());
}